

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugger.cxx
# Opt level: O0

void __thiscall cmDebugger_impl::ClearAllWatchpoints(cmDebugger_impl *this)

{
  bool bVar1;
  reference pcVar2;
  cmWatchpoint *watch;
  iterator __end1;
  iterator __begin1;
  vector<cmWatchpoint,_std::allocator<cmWatchpoint>_> *__range1;
  vector<cmWatchpoint,_std::allocator<cmWatchpoint>_> watchpoints;
  cmDebugger_impl *this_local;
  
  watchpoints.super__Vector_base<cmWatchpoint,_std::allocator<cmWatchpoint>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  (*(this->super_cmDebugger)._vptr_cmDebugger[8])(&__range1);
  __end1 = std::vector<cmWatchpoint,_std::allocator<cmWatchpoint>_>::begin
                     ((vector<cmWatchpoint,_std::allocator<cmWatchpoint>_> *)&__range1);
  watch = (cmWatchpoint *)
          std::vector<cmWatchpoint,_std::allocator<cmWatchpoint>_>::end
                    ((vector<cmWatchpoint,_std::allocator<cmWatchpoint>_> *)&__range1);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<cmWatchpoint_*,_std::vector<cmWatchpoint,_std::allocator<cmWatchpoint>_>_>
                                *)&watch);
    if (!bVar1) break;
    pcVar2 = __gnu_cxx::
             __normal_iterator<cmWatchpoint_*,_std::vector<cmWatchpoint,_std::allocator<cmWatchpoint>_>_>
             ::operator*(&__end1);
    (*(this->super_cmDebugger)._vptr_cmDebugger[0x13])(this,pcVar2->Id);
    __gnu_cxx::
    __normal_iterator<cmWatchpoint_*,_std::vector<cmWatchpoint,_std::allocator<cmWatchpoint>_>_>::
    operator++(&__end1);
  }
  std::vector<cmWatchpoint,_std::allocator<cmWatchpoint>_>::~vector
            ((vector<cmWatchpoint,_std::allocator<cmWatchpoint>_> *)&__range1);
  return;
}

Assistant:

void ClearAllWatchpoints() override
  {
    auto watchpoints = GetWatchpoints();
    for (auto& watch : watchpoints) {
      ClearWatchpoint(watch.Id);
    }
  }